

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialog::selectUrl(QFileDialog *this,QUrl *url)

{
  QDialogPrivate *this_00;
  char cVar1;
  QPlatformDialogHelper *pQVar2;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  cVar1 = QUrl::isValid();
  if (cVar1 != '\0') {
    if (this_00->nativeDialogInUse == true) {
      pQVar2 = QDialogPrivate::platformHelper(this_00);
      if (pQVar2 != (QPlatformDialogHelper *)0x0) {
        cVar1 = (**(code **)(*(long *)pQVar2 + 0xd0))(pQVar2,url);
        if (cVar1 != '\0') {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            (**(code **)(*(long *)pQVar2 + 0x98))(pQVar2,url);
            return;
          }
          goto LAB_004e260b;
        }
      }
    }
    else {
      cVar1 = QUrl::isLocalFile();
      if (cVar1 == '\0') {
        selectUrl();
      }
      else {
        QUrl::toLocalFile();
        selectFile(this,&local_38);
        if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_004e260b:
  __stack_chk_fail();
}

Assistant:

void QFileDialog::selectUrl(const QUrl &url)
{
    Q_D(QFileDialog);
    if (!url.isValid())
        return;

    if (d->nativeDialogInUse)
        d->selectFile_sys(url);
    else if (url.isLocalFile())
        selectFile(url.toLocalFile());
    else
        qWarning("Non-native QFileDialog supports only local files");
}